

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack4_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  
  auVar2 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  uVar1 = *in;
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar3 = vpsrlvd_avx2(auVar10,auVar2);
  auVar12._8_8_ = 0x1800000014;
  auVar12._0_8_ = 0x1800000014;
  auVar7 = vpbroadcastd_avx512f();
  auVar4 = vpsrlvd_avx2(auVar7._0_16_,auVar2);
  auVar5 = vpsrlvd_avx2(auVar7._0_16_,auVar12);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar3),ZEXT1632(auVar3),7);
  auVar6 = vpblendd_avx2(auVar6,ZEXT1632(auVar10),1);
  auVar2 = vpshufd_avx(auVar12,0x50);
  auVar2 = vpsrlvd_avx2(auVar10,auVar2);
  auVar11._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar11._16_16_ = ZEXT116(1) * auVar2;
  auVar6 = vpblendd_avx2(auVar6,auVar11,0x60);
  auVar7 = vpbroadcastd_avx512f();
  auVar8 = vpmovsxbd_avx512f(_DAT_0019fe90);
  auVar7 = vpermi2d_avx512f(auVar8,ZEXT3664(CONCAT432(auVar7._32_4_,auVar6)),ZEXT1664(auVar4));
  auVar8 = vpmovsxbd_avx512f(_DAT_001ad390);
  auVar8 = vpermi2d_avx512f(auVar8,auVar7,ZEXT1664(auVar5));
  auVar9 = valignd_avx512f(auVar8,auVar8,9);
  auVar7._8_4_ = 0xf;
  auVar7._0_8_ = 0xf0000000f;
  auVar7._12_4_ = 0xf;
  auVar7._16_4_ = 0xf;
  auVar7._20_4_ = 0xf;
  auVar7._24_4_ = 0xf;
  auVar7._28_4_ = 0xf;
  auVar7._32_4_ = 0xf;
  auVar7._36_4_ = 0xf;
  auVar7._40_4_ = 0xf;
  auVar7._44_4_ = 0xf;
  auVar7._48_4_ = 0xf;
  auVar7._52_4_ = 0xf;
  auVar7._56_4_ = 0xf;
  auVar7._60_4_ = 0xf;
  auVar7 = vpandd_avx512f(auVar8,auVar7);
  auVar8 = vpsrld_avx512f(auVar9,0x1c);
  auVar9._0_28_ = auVar7._0_28_;
  auVar9._28_4_ = auVar8._28_4_;
  auVar9._32_4_ = auVar7._32_4_;
  auVar9._36_4_ = auVar7._36_4_;
  auVar9._40_4_ = auVar7._40_4_;
  auVar9._44_4_ = auVar7._44_4_;
  auVar9._48_4_ = auVar7._48_4_;
  auVar9._52_4_ = auVar7._52_4_;
  auVar9._60_4_ = auVar8._60_4_;
  auVar9._56_4_ = auVar7._56_4_;
  auVar7 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])out = auVar7;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack4_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}